

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int png_image_free_function(png_voidp argument)

{
  FILE *__stream;
  FILE *fp;
  png_control c;
  png_controlp cp;
  png_imagep image;
  png_voidp argument_local;
  
  c._40_8_ = *argument;
  if (*(long *)c._40_8_ == 0) {
    argument_local._4_4_ = 0;
  }
  else {
    if ((*(byte *)(c._40_8_ + 0x28) >> 1 & 1) != 0) {
      __stream = *(FILE **)(*(long *)c._40_8_ + 0x108);
      *(byte *)(c._40_8_ + 0x28) = *(byte *)(c._40_8_ + 0x28) & 0xfd;
      if (__stream != (FILE *)0x0) {
        *(undefined8 *)(*(long *)c._40_8_ + 0x108) = 0;
        fclose(__stream);
      }
    }
    memcpy(&fp,(void *)c._40_8_,0x30);
    *(FILE ***)argument = &fp;
    png_free((png_const_structrp)fp,(png_voidp)c._40_8_);
    if (((byte)c.size & 1) == 0) {
      png_destroy_read_struct((png_structpp)&fp,(png_infopp)&c,(png_infopp)0x0);
    }
    else {
      png_destroy_write_struct((png_structpp)&fp,(png_infopp)&c);
    }
    argument_local._4_4_ = 1;
  }
  return argument_local._4_4_;
}

Assistant:

static int
png_image_free_function(png_voidp argument)
{
   png_imagep image = png_voidcast(png_imagep, argument);
   png_controlp cp = image->opaque;
   png_control c;

   /* Double check that we have a png_ptr - it should be impossible to get here
    * without one.
    */
   if (cp->png_ptr == NULL)
      return 0;

   /* First free any data held in the control structure. */
#  ifdef PNG_STDIO_SUPPORTED
      if (cp->owned_file != 0)
      {
         FILE *fp = png_voidcast(FILE*, cp->png_ptr->io_ptr);
         cp->owned_file = 0;

         /* Ignore errors here. */
         if (fp != NULL)
         {
            cp->png_ptr->io_ptr = NULL;
            (void)fclose(fp);
         }
      }
#  endif

   /* Copy the control structure so that the original, allocated, version can be
    * safely freed.  Notice that a png_error here stops the remainder of the
    * cleanup, but this is probably fine because that would indicate bad memory
    * problems anyway.
    */
   c = *cp;
   image->opaque = &c;
   png_free(c.png_ptr, cp);

   /* Then the structures, calling the correct API. */
   if (c.for_write != 0)
   {
#     ifdef PNG_SIMPLIFIED_WRITE_SUPPORTED
         png_destroy_write_struct(&c.png_ptr, &c.info_ptr);
#     else
         png_error(c.png_ptr, "simplified write not supported");
#     endif
   }
   else
   {
#     ifdef PNG_SIMPLIFIED_READ_SUPPORTED
         png_destroy_read_struct(&c.png_ptr, &c.info_ptr, NULL);
#     else
         png_error(c.png_ptr, "simplified read not supported");
#     endif
   }

   /* Success. */
   return 1;
}